

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrDec.c
# Opt level: O1

void Rwr_ManPreprocess(Rwr_Man_t *p)

{
  byte bVar1;
  short sVar2;
  undefined4 uVar3;
  Rwr_Node_t *pRVar4;
  uint *puVar5;
  Dec_Edge_t DVar6;
  uint uVar7;
  unsigned_short *__s;
  Vec_Vec_t *pVVar8;
  void **ppvVar9;
  undefined8 *puVar10;
  void *pvVar11;
  Rwr_Node_t *pGraph_00;
  int iVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  Dec_Graph_t *pGraph;
  
  __s = (unsigned_short *)malloc(0x1bc);
  p->pMapInv = __s;
  lVar14 = 0;
  memset(__s,0,0x1bc);
  pVVar8 = (Vec_Vec_t *)malloc(0x10);
  pVVar8->nCap = 0xde;
  pVVar8->nSize = 0;
  ppvVar9 = (void **)malloc(0x6f0);
  pVVar8->pArray = ppvVar9;
  do {
    puVar10 = (undefined8 *)malloc(0x10);
    *puVar10 = 0;
    puVar10[1] = 0;
    ppvVar9[lVar14] = puVar10;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0xde);
  pVVar8->nSize = 0xde;
  p->vClasses = pVVar8;
  if (0 < p->nFuncs) {
    lVar14 = 0;
    do {
      for (pRVar4 = p->pTable[lVar14]; pRVar4 != (Rwr_Node_t *)0x0; pRVar4 = pRVar4->pNext) {
        if (*(ushort *)&pRVar4->field_0xe != *(ushort *)&p->pTable[lVar14]->field_0xe) {
          __assert_fail("pNode->uTruth == p->pTable[i]->uTruth",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/rwr/rwrDec.c"
                        ,0x41,"void Rwr_ManPreprocess(Rwr_Man_t *)");
        }
        bVar1 = p->pMap[*(ushort *)&pRVar4->field_0xe];
        if (0xdd < bVar1) {
          __assert_fail("p->pMap[pNode->uTruth] < 222",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/rwr/rwrDec.c"
                        ,0x42,"void Rwr_ManPreprocess(Rwr_Man_t *)");
        }
        pVVar8 = p->vClasses;
        uVar7 = (uint)bVar1;
        if (pVVar8->nSize <= (int)(uint)bVar1) {
          iVar12 = bVar1 + 1;
          if (pVVar8->nCap <= (int)(uint)bVar1) {
            if (pVVar8->pArray == (void **)0x0) {
              ppvVar9 = (void **)malloc((ulong)(uint)(iVar12 * 8));
            }
            else {
              ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)(uint)(iVar12 * 8));
            }
            pVVar8->pArray = ppvVar9;
            pVVar8->nCap = iVar12;
          }
          iVar13 = pVVar8->nSize;
          lVar16 = (long)iVar13;
          if (iVar13 <= (int)uVar7) {
            iVar13 = (uVar7 - iVar13) + 1;
            do {
              puVar10 = (undefined8 *)malloc(0x10);
              *puVar10 = 0;
              puVar10[1] = 0;
              pVVar8->pArray[lVar16] = puVar10;
              lVar16 = lVar16 + 1;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          pVVar8->nSize = iVar12;
        }
        if (pVVar8->nSize <= (int)uVar7) goto LAB_008d54d1;
        puVar5 = (uint *)pVVar8->pArray[uVar7];
        uVar7 = *puVar5;
        if (puVar5[1] == uVar7) {
          if ((int)uVar7 < 0x10) {
            if (*(void **)(puVar5 + 2) == (void *)0x0) {
              pvVar11 = malloc(0x80);
            }
            else {
              pvVar11 = realloc(*(void **)(puVar5 + 2),0x80);
            }
            *(void **)(puVar5 + 2) = pvVar11;
            uVar15 = 0x10;
          }
          else {
            uVar15 = uVar7 * 2;
            if ((int)uVar15 <= (int)uVar7) goto LAB_008d5307;
            if (*(void **)(puVar5 + 2) == (void *)0x0) {
              pvVar11 = malloc((ulong)uVar7 << 4);
            }
            else {
              pvVar11 = realloc(*(void **)(puVar5 + 2),(ulong)uVar7 << 4);
            }
            *(void **)(puVar5 + 2) = pvVar11;
          }
          *puVar5 = uVar15;
        }
LAB_008d5307:
        uVar7 = puVar5[1];
        puVar5[1] = uVar7 + 1;
        *(Rwr_Node_t **)(*(long *)(puVar5 + 2) + (long)(int)uVar7 * 8) = pRVar4;
        p->pMapInv[p->pMap[*(ushort *)&pRVar4->field_0xe]] =
             p->puCanons[*(ushort *)&pRVar4->field_0xe];
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < p->nFuncs);
  }
  if (0 < p->vClasses->nSize) {
    lVar14 = 0;
    do {
      pVVar8 = p->vClasses;
      if (pVVar8->nSize <= lVar14) {
LAB_008d54d1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      lVar16 = 0;
      while (lVar16 < *(int *)((long)pVVar8->pArray[lVar14] + 4)) {
        pRVar4 = *(Rwr_Node_t **)(*(long *)((long)pVVar8->pArray[lVar14] + 8) + lVar16 * 8);
        if (((ulong)pRVar4 & 1) != 0) {
          __assert_fail("!Rwr_IsComplement(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/rwr/rwrDec.c"
                        ,0x5f,"Dec_Graph_t *Rwr_NodePreprocess(Rwr_Man_t *, Rwr_Node_t *)");
        }
        sVar2 = *(short *)&pRVar4->field_0xe;
        pGraph_00 = (Rwr_Node_t *)malloc(0x20);
        pGraph_00->Id = 0;
        pGraph_00->TravId = 0;
        pGraph_00->nScore = 0;
        pGraph_00->nGain = 0;
        pGraph_00->nAdded = 0;
        *(undefined2 *)&pGraph_00->field_0xe = 0;
        *(undefined8 *)&pGraph_00->field_0x10 = 0;
        pGraph_00->p0 = (Rwr_Node_t *)0x0;
        if (sVar2 == 0xff) {
          pGraph_00->TravId = 4;
          pGraph_00->nScore = 4;
          pGraph_00->nGain = 0;
          *(undefined4 *)&pGraph_00->nAdded = 0x3a;
          puVar10 = (undefined8 *)malloc(0x570);
          *(undefined8 **)&pGraph_00->field_0x10 = puVar10;
          *puVar10 = 0;
          puVar10[1] = 0;
          puVar10[2] = 0;
          puVar10[3] = 0;
          puVar10[4] = 0;
          puVar10[5] = 0;
          puVar10[6] = 0;
          puVar10[7] = 0;
          puVar10[8] = 0;
          puVar10[9] = 0;
          puVar10[10] = 0;
          puVar10[0xb] = 0;
          DVar6 = (Dec_Edge_t)(*(uint *)&pGraph_00->p0 & 0x80000000 | 7);
LAB_008d547e:
          *(Dec_Edge_t *)&pGraph_00->p0 = DVar6;
        }
        else {
          if (sVar2 != 0) {
            pGraph_00->TravId = 4;
            pGraph_00->nScore = 4;
            pGraph_00->nGain = 0;
            *(undefined4 *)&pGraph_00->nAdded = 0x3a;
            puVar10 = (undefined8 *)malloc(0x570);
            *(undefined8 **)&pGraph_00->field_0x10 = puVar10;
            *puVar10 = 0;
            puVar10[1] = 0;
            puVar10[2] = 0;
            puVar10[3] = 0;
            puVar10[4] = 0;
            puVar10[5] = 0;
            puVar10[6] = 0;
            puVar10[7] = 0;
            puVar10[8] = 0;
            puVar10[9] = 0;
            puVar10[10] = 0;
            puVar10[0xb] = 0;
            Rwr_ManIncTravId(p);
            DVar6 = Rwr_TravCollect_rec(p,pRVar4,(Dec_Graph_t *)pGraph_00);
            goto LAB_008d547e;
          }
          pGraph_00->Id = 1;
          *(byte *)&pGraph_00->p0 = *(byte *)&pGraph_00->p0 | 1;
        }
        pRVar4->pNext = pGraph_00;
        uVar3 = *(undefined4 *)&pRVar4->field_0xe;
        uVar7 = Dec_GraphDeriveTruth((Dec_Graph_t *)pGraph_00);
        if ((short)uVar7 != (short)uVar3) {
          __assert_fail("pNode->uTruth == (Dec_GraphDeriveTruth(pGraph) & 0xFFFF)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/rwr/rwrDec.c"
                        ,0x4c,"void Rwr_ManPreprocess(Rwr_Man_t *)");
        }
        lVar16 = lVar16 + 1;
        pVVar8 = p->vClasses;
        if (pVVar8->nSize <= lVar14) goto LAB_008d54d1;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < p->vClasses->nSize);
  }
  return;
}

Assistant:

void Rwr_ManPreprocess( Rwr_Man_t * p )
{
    Dec_Graph_t * pGraph;
    Rwr_Node_t * pNode;
    int i, k;
    // put the nodes into the structure
    p->pMapInv  = ABC_ALLOC( unsigned short, 222 );
    memset( p->pMapInv, 0, sizeof(unsigned short) * 222 );
    p->vClasses = Vec_VecStart( 222 );
    for ( i = 0; i < p->nFuncs; i++ )
    {
        if ( p->pTable[i] == NULL )
            continue;
        // consider all implementations of this function
        for ( pNode = p->pTable[i]; pNode; pNode = pNode->pNext )
        {
            assert( pNode->uTruth == p->pTable[i]->uTruth );
            assert( p->pMap[pNode->uTruth] < 222 ); // Guaranteed to be >=0 b/c unsigned
            Vec_VecPush( p->vClasses, p->pMap[pNode->uTruth], pNode );
            p->pMapInv[ p->pMap[pNode->uTruth] ] = p->puCanons[pNode->uTruth];
        }
    }
    // compute decomposition forms for each node and verify them
    Vec_VecForEachEntry( Rwr_Node_t *, p->vClasses, pNode, i, k )
    {
        pGraph = Rwr_NodePreprocess( p, pNode );
        pNode->pNext = (Rwr_Node_t *)pGraph;
        assert( pNode->uTruth == (Dec_GraphDeriveTruth(pGraph) & 0xFFFF) );
    }
}